

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-doc.c
# Opt level: O3

int fy_node_sequence_append(fy_node *fyn_seq,fy_node *fyn)

{
  list_head *plVar1;
  int iVar2;
  int iVar3;
  fy_node *pfVar4;
  
  iVar2 = fy_node_sequence_insert_prepare(fyn_seq,fyn);
  iVar3 = -1;
  if (iVar2 == 0) {
    if (fyn_seq != (fy_node *)0x0) {
      fyn_seq->field_0x34 = fyn_seq->field_0x34 | 0x10;
      for (pfVar4 = fyn_seq->parent; pfVar4 != (fy_node *)0x0; pfVar4 = pfVar4->parent) {
        pfVar4->field_0x34 = pfVar4->field_0x34 | 0x10;
      }
    }
    if (fyn != (fy_node *)0x0) {
      plVar1 = (fyn_seq->field_12).sequence._lh.prev;
      (fyn_seq->field_12).sequence._lh.prev = &fyn->node;
      (fyn->node).next = (list_head *)&fyn_seq->field_12;
      (fyn->node).prev = plVar1;
      plVar1->next = &fyn->node;
    }
    fyn->field_0x34 = fyn->field_0x34 | 8;
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int fy_node_sequence_append(struct fy_node *fyn_seq, struct fy_node *fyn) {
    int ret;

    ret = fy_node_sequence_insert_prepare(fyn_seq, fyn);
    if (ret)
        return ret;

    fy_node_mark_synthetic(fyn_seq);
    fy_node_list_add_tail(&fyn_seq->sequence, fyn);
    fyn->attached = true;
    return 0;
}